

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::PipelineBarrier::PipelineBarrier
          (PipelineBarrier *this,VkPipelineStageFlags srcStages,VkAccessFlags srcAccesses,
          VkPipelineStageFlags dstStages,VkAccessFlags dstAccesses,Type type,
          Maybe<vk::VkImageLayout> *imageLayout)

{
  Type type_local;
  VkAccessFlags dstAccesses_local;
  VkPipelineStageFlags dstStages_local;
  VkAccessFlags srcAccesses_local;
  VkPipelineStageFlags srcStages_local;
  PipelineBarrier *this_local;
  
  CmdCommand::CmdCommand(&this->super_CmdCommand);
  (this->super_CmdCommand)._vptr_CmdCommand = (_func_int **)&PTR__PipelineBarrier_016aad90;
  this->m_srcStages = srcStages;
  this->m_srcAccesses = srcAccesses;
  this->m_dstStages = dstStages;
  this->m_dstAccesses = dstAccesses;
  this->m_type = type;
  tcu::Maybe<vk::VkImageLayout>::Maybe(&this->m_imageLayout,imageLayout);
  return;
}

Assistant:

PipelineBarrier::PipelineBarrier (const vk::VkPipelineStageFlags		srcStages,
								  const vk::VkAccessFlags				srcAccesses,
								  const vk::VkPipelineStageFlags		dstStages,
								  const vk::VkAccessFlags				dstAccesses,
								  Type									type,
								  const tcu::Maybe<vk::VkImageLayout>	imageLayout)
	: m_srcStages	(srcStages)
	, m_srcAccesses	(srcAccesses)
	, m_dstStages	(dstStages)
	, m_dstAccesses	(dstAccesses)
	, m_type		(type)
	, m_imageLayout	(imageLayout)
{
}